

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O2

ebml_element * Copy(ebml_element *Element)

{
  filepos_t fVar1;
  ebml_element *peVar2;
  
  peVar2 = EBML_ElementCreate(Element,Element->Context,0,-1);
  if (peVar2 != (ebml_element *)0x0) {
    peVar2->bValueIsSet = Element->bValueIsSet;
    fVar1 = Element->ElementPosition;
    peVar2->DataSize = Element->DataSize;
    peVar2->ElementPosition = fVar1;
    peVar2->SizeLength = Element->SizeLength;
    fVar1 = Element->EndPosition;
    peVar2->SizePosition = Element->SizePosition;
    peVar2->EndPosition = fVar1;
    peVar2->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
  }
  return peVar2;
}

Assistant:

static ebml_string *Copy(const ebml_string *Element)
{
    ebml_string *Result = (ebml_string*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->Buffer = malloc(Element->Base.DataSize + 1);
        if (Result->Buffer == NULL)
        {
            NodeDelete((node*)Result);
            return NULL;
        }
        strncpy((char*)Result->Buffer, Element->Buffer, Element->Base.DataSize + 1);
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
    }
    return Result;
}